

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O1

void qsound_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint *puVar1;
  size_t __n;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (*(int *)((long)param + 0x250) != 0) {
    lVar4 = 0;
    do {
      if ((*(char *)((long)param + lVar4 * 0x24 + 0x1a) != '\0') &&
         (puVar1 = (uint *)((long)param + lVar4 * 0x24 + 8), (char)puVar1[8] == '\0' && samples != 0
         )) {
        uVar2 = *(ushort *)((long)puVar1 + 10);
        uVar5 = 0;
        do {
          uVar6 = (puVar1[7] >> 0xc) + puVar1[1];
          puVar1[1] = uVar6;
          uVar7 = (puVar1[7] & 0xfff) + puVar1[3];
          puVar1[7] = uVar7;
          if (uVar2 <= uVar6) {
            uVar3 = (ushort)puVar1[2];
            if (uVar3 == 0) {
              puVar1[1] = uVar6 - 1;
              puVar1[7] = uVar7 + 0x1000;
              break;
            }
            uVar6 = uVar6 - uVar3;
            uVar7 = (uint)uVar2 - (uint)uVar3;
            if (uVar6 < uVar2) {
              uVar7 = uVar6;
            }
            puVar1[1] = uVar7 & 0xffff;
          }
          iVar8 = (uint)(ushort)puVar1[4] *
                  (int)*(char *)(*(long *)((long)param + 0x248) +
                                (ulong)((puVar1[1] | *puVar1) & *(uint *)((long)param + 0x254)));
          (*outputs)[uVar5] = (*outputs)[uVar5] + ((int)(puVar1[5] * iVar8) >> 0xe);
          outputs[1][uVar5] = outputs[1][uVar5] + ((int)(iVar8 * puVar1[6]) >> 0xe);
          uVar5 = uVar5 + 1;
        } while (samples != uVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
  }
  return;
}

Assistant:

static void qsound_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	qsound_state *chip = (qsound_state *)param;
	UINT32 i,j;
	UINT32 offset;
	INT8 sample;
	qsound_channel *pC;

	// Clear the buffers
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	if (! chip->sample_rom_length)
		return;

	for (j = 0; j < QSOUND_CHANNELS; j++)
	{
		pC=&chip->channel[j];
		if (pC->enabled && ! pC->Muted)
		{
			// Go through the buffer and add voice contributions
			for (i = 0; i < samples; i++)
			{
				pC->address += (pC->step_ptr >> 12);
				pC->step_ptr &= 0xfff;
				pC->step_ptr += pC->freq;

				if (pC->address >= pC->end)
				{
					if (pC->loop)
					{
						// Reached the end, restart the loop
						pC->address -= pC->loop;

						// Make sure we don't overflow (what does the real chip do in this case?)
						if (pC->address >= pC->end)
							pC->address = pC->end - pC->loop;

						pC->address &= 0xffff;
					}
					else
					{
						// Reached the end of a non-looped sample
						//pC->enabled = 0;
						pC->address --;	// ensure that old ripped VGMs still work
						pC->step_ptr += 0x1000;
						break;
					}
				}
				
				offset = pC->bank | pC->address;
				sample = chip->sample_rom[offset & chip->sample_rom_mask];
				outputs[0][i] += ((sample * pC->lvol * pC->vol) >> 14);
				outputs[1][i] += ((sample * pC->rvol * pC->vol) >> 14);
			}
		}
	}
}